

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O1

void __thiscall
density::
sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::reentrant_consume_operation::~reentrant_consume_operation(reentrant_consume_operation *this)

{
  bool bVar1;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::empty((Consume *)this);
  if (!bVar1) {
    LOCK();
    **(long **)(this + 8) = *(long *)(this + 0x10) + -2;
    UNLOCK();
    *(undefined8 *)(this + 0x10) = 0;
  }
  if (*(void **)(this + 8) != (void *)0x0) {
    density_tests::UnmovableFastTestAllocator<256UL>::unpin_page
              (*(UnmovableFastTestAllocator<256UL> **)this,*(void **)(this + 8));
    return;
  }
  return;
}

Assistant:

~reentrant_consume_operation()
            {
                if (!m_consume_data.empty())
                {
                    m_consume_data.cancel_consume_impl();
                }
            }